

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODMultiUPCEANReader.cpp
# Opt level: O1

bool ZXing::OneD::AddOn(PartialResult *res,PatternView begin,int digitCount)

{
  char *__nptr;
  double dVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  undefined8 uVar7;
  uint uVar8;
  PartialResult *txt;
  int iVar9;
  int CHECK_DIGIT_ENCODINGS [10];
  int local_8c;
  PatternView local_88;
  double local_68;
  PartialResult *local_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_88._size = digitCount * 6 + 1;
  local_88._data = begin._data;
  local_88._base = begin._base;
  local_88._end = begin._end;
  if (begin._data == (Iterator)0x0) {
    return false;
  }
  if (begin._data < begin._base) {
    return false;
  }
  if (begin._end < begin._data + (uint)local_88._size) {
    return false;
  }
  local_60 = res;
  local_68 = IsPattern<false,3,4>
                       (&local_88,(FixedPattern<3,_4,_false> *)&EXT_START_PATTERN,0,0.0,0.0);
  if ((local_68 == 0.0) && (!NAN(local_68))) {
    return false;
  }
  if ((local_88._data + local_88._size == local_88._end + -1) ||
     (local_68 * 3.0 + -1.0 < (double)local_88._data[local_88._size])) {
    (local_60->end)._base = local_88._base;
    (local_60->end)._end = local_88._end;
    (local_60->end)._data = local_88._data;
    *(ulong *)&(local_60->end)._size = CONCAT44(local_88._12_4_,local_88._size);
    local_88._data = local_88._data + 3;
    local_88._size = 4;
    local_8c = 0;
    (local_60->txt)._M_string_length = 0;
    *(local_60->txt)._M_dataplus._M_p = '\0';
    txt = local_60;
    if (0 < digitCount) {
      iVar9 = 0;
      do {
        bVar2 = DecodeDigit(&local_88,&txt->txt,&local_8c);
        if (!bVar2) {
          return false;
        }
        if (local_88._data != (Iterator)0x0) {
          local_88._data = local_88._data + local_88._size;
        }
        if (iVar9 < digitCount + -1) {
          dVar1 = IsPattern<false,2,2>
                            (&local_88,(FixedPattern<2,_2,_false> *)&EXT_SEPARATOR_PATTERN,0,0.0,
                             local_68);
          if ((dVar1 == 0.0) && (!NAN(dVar1))) {
            return false;
          }
          txt = local_60;
          if (local_88._data != (Iterator)0x0) {
            local_88._data = local_88._data + 2;
          }
        }
        iVar9 = iVar9 + 1;
      } while (digitCount != iVar9);
    }
    if (digitCount == 2) {
      __nptr = (txt->txt)._M_dataplus._M_p;
      piVar5 = __errno_location();
      iVar9 = *piVar5;
      *piVar5 = 0;
      lVar6 = strtol(__nptr,(char **)&local_58,10);
      if ((char *)CONCAT44(local_58._4_4_,(undefined4)local_58) == __nptr) {
        std::__throw_invalid_argument("stoi");
      }
      else {
        uVar3 = (uint)lVar6;
        if (((int)uVar3 == lVar6) && (*piVar5 != 0x22)) {
          if (*piVar5 == 0) {
            *piVar5 = iVar9;
          }
          uVar8 = uVar3 + 3;
          if (-1 < (int)uVar3) {
            uVar8 = uVar3;
          }
          if (uVar3 - (uVar8 & 0xfffffffc) != local_8c) {
            return false;
          }
          goto LAB_00165bb0;
        }
      }
      uVar7 = std::__throw_out_of_range("stoi");
      if (*piVar5 == 0) {
        *piVar5 = iVar9;
      }
      _Unwind_Resume(uVar7);
    }
    local_48 = 0x60000000c;
    uStack_40 = 0xa00000003;
    local_58._0_4_ = 0x18;
    local_58._4_4_ = 0x14;
    uStack_50 = 0x12;
    uStack_4c = 0x11;
    local_38 = 0x500000009;
    iVar9 = 0;
    uVar3 = (uint)(txt->txt)._M_string_length;
    if (1 < (int)uVar3) {
      lVar6 = (ulong)(uVar3 & 0x7fffffff) + 2;
      iVar9 = 0;
      do {
        iVar9 = iVar9 + (txt->txt)._M_dataplus._M_p[lVar6 + -4] + -0x30;
        lVar6 = lVar6 + -2;
      } while (3 < lVar6);
      iVar9 = iVar9 * 3;
    }
    if (0 < (int)uVar3) {
      lVar6 = (ulong)(uVar3 - 1) + 2;
      do {
        iVar9 = iVar9 + (txt->txt)._M_dataplus._M_p[lVar6 + -2] + -0x30;
        lVar6 = lVar6 + -2;
      } while (1 < lVar6);
    }
    piVar5 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                       (&local_58,&stack0xffffffffffffffd0,&local_8c);
    iVar4 = -1;
    if (piVar5 != (int *)&stack0xffffffffffffffd0) {
      iVar4 = (int)((ulong)((long)piVar5 - (long)&local_58) >> 2);
    }
    if ((iVar9 * 3) % 10 == iVar4) {
LAB_00165bb0:
      txt->format = Any;
      return true;
    }
  }
  return false;
}

Assistant:

static bool AddOn(PartialResult& res, PatternView begin, int digitCount)
{
	auto ext = begin.subView(0, 3 + digitCount * 4 + (digitCount - 1) * 2);
	CHECK(ext.isValid());
	auto moduleSize = IsPattern(ext, EXT_START_PATTERN);
	CHECK(moduleSize);

	CHECK(ext.isAtLastBar() || *ext.end() > QUIET_ZONE_ADDON * moduleSize - 1);

	res.end = ext;
	ext = ext.subView(EXT_START_PATTERN.size(), CHAR_LEN);
	int lgPattern = 0;
	res.txt.clear();

	for (int i = 0; i < digitCount; ++i) {
		CHECK(DecodeDigit(ext, res.txt, &lgPattern));
		ext.skipSymbol();
		if (i < digitCount - 1) {
			CHECK(IsPattern(ext, EXT_SEPARATOR_PATTERN, 0, 0, moduleSize));
			ext.skipPair();
		}
	}

	if (digitCount == 2) {
		CHECK(std::stoi(res.txt) % 4 == lgPattern);
	} else {
		constexpr int CHECK_DIGIT_ENCODINGS[] = {0x18, 0x14, 0x12, 0x11, 0x0C, 0x06, 0x03, 0x0A, 0x09, 0x05};
		CHECK(Ean5Checksum(res.txt) == IndexOf(CHECK_DIGIT_ENCODINGS, lgPattern));
	}
	res.format = BarcodeFormat::Any; // make sure res.format is valid, see below
	return true;
}